

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O3

NodeSequence __thiscall
GraphBuilder::insertPthreadMutexLock(GraphBuilder *this,CallInst *callInstruction)

{
  long lVar1;
  LockNode *this_00;
  CallInst *callInst;
  NodeSequence NVar2;
  
  lVar1 = *(long *)(callInstruction + -0x20);
  if (((lVar1 == 0) || (*(char *)(lVar1 + 0x10) != '\0')) ||
     (*(long *)(lVar1 + 0x18) != *(long *)(callInstruction + 0x48))) {
    this_00 = (LockNode *)operator_new(0xb0);
    callInst = callInstruction;
    callInstruction = (CallInst *)(Instruction *)0x0;
  }
  else {
    this_00 = (LockNode *)operator_new(0xb0);
    callInst = (CallInst *)0x0;
  }
  LockNode::LockNode(this_00,(Instruction *)callInstruction,callInst);
  NVar2.first = addNode<LockNode>(this,this_00);
  NVar2.second = &(NVar2.first)->super_Node;
  return NVar2;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::insertPthreadMutexLock(const CallInst *callInstruction) {
    LockNode *lockNode;
    if (callInstruction->getCalledFunction()) {
        lockNode = addNode(createNode<NodeType::LOCK>(callInstruction));
    } else {
        lockNode =
                addNode(createNode<NodeType::LOCK>(nullptr, callInstruction));
    }

    return {lockNode, lockNode};
}